

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O0

jpc_dec_cp_t * jpc_dec_cp_create(uint_fast16_t numcomps)

{
  jpc_dec_cp_t *cp_00;
  jpc_dec_ccp_t *pjVar1;
  jpc_pchglist_t *pjVar2;
  int local_2c;
  jpc_dec_ccp_t *pjStack_28;
  int compno;
  jpc_dec_ccp_t *ccp;
  jpc_dec_cp_t *cp;
  uint_fast16_t numcomps_local;
  
  cp_00 = (jpc_dec_cp_t *)jas_malloc(0x30);
  if (cp_00 != (jpc_dec_cp_t *)0x0) {
    cp_00->flags = 0;
    cp_00->numcomps = (int)numcomps;
    cp_00->prgord = '\0';
    cp_00->numlyrs = 0;
    cp_00->mctid = '\0';
    cp_00->csty = '\0';
    pjVar1 = (jpc_dec_ccp_t *)jas_alloc2((long)cp_00->numcomps,0x380);
    cp_00->ccps = pjVar1;
    if (pjVar1 != (jpc_dec_ccp_t *)0x0) {
      pjVar2 = jpc_pchglist_create();
      cp_00->pchglist = pjVar2;
      if (pjVar2 != (jpc_pchglist_t *)0x0) {
        local_2c = 0;
        pjStack_28 = cp_00->ccps;
        for (; local_2c < cp_00->numcomps; local_2c = local_2c + 1) {
          pjStack_28->flags = 0;
          pjStack_28->numrlvls = '\0';
          pjStack_28->cblkwidthexpn = '\0';
          pjStack_28->cblkheightexpn = '\0';
          pjStack_28->qmfbid = '\0';
          pjStack_28->numstepsizes = 0;
          pjStack_28->numguardbits = '\0';
          pjStack_28->roishift = '\0';
          pjStack_28->cblkctx = '\0';
          pjStack_28 = pjStack_28 + 1;
        }
        return cp_00;
      }
    }
    if (cp_00 != (jpc_dec_cp_t *)0x0) {
      jpc_dec_cp_destroy(cp_00);
    }
  }
  return (jpc_dec_cp_t *)0x0;
}

Assistant:

static jpc_dec_cp_t *jpc_dec_cp_create(uint_fast16_t numcomps)
{
	jpc_dec_cp_t *cp;
	jpc_dec_ccp_t *ccp;
	int compno;

	if (!(cp = jas_malloc(sizeof(jpc_dec_cp_t)))) {
		return 0;
	}
	cp->flags = 0;
	cp->numcomps = numcomps;
	cp->prgord = 0;
	cp->numlyrs = 0;
	cp->mctid = 0;
	cp->csty = 0;
	if (!(cp->ccps = jas_alloc2(cp->numcomps, sizeof(jpc_dec_ccp_t)))) {
		goto error;
	}
	if (!(cp->pchglist = jpc_pchglist_create())) {
		goto error;
	}
	for (compno = 0, ccp = cp->ccps; compno < cp->numcomps;
	  ++compno, ++ccp) {
		ccp->flags = 0;
		ccp->numrlvls = 0;
		ccp->cblkwidthexpn = 0;
		ccp->cblkheightexpn = 0;
		ccp->qmfbid = 0;
		ccp->numstepsizes = 0;
		ccp->numguardbits = 0;
		ccp->roishift = 0;
		ccp->cblkctx = 0;
	}
	return cp;
error:
	if (cp) {
		jpc_dec_cp_destroy(cp);
	}
	return 0;
}